

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O3

int __kmp_api_omp_get_team_num(void)

{
  kmp_info_t *pkVar1;
  int iVar2;
  kmp_team_p *pkVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  iVar2 = __kmp_get_global_thread_id_reg();
  pkVar1 = __kmp_threads[iVar2];
  iVar2 = 0;
  if ((pkVar1->th).th_teams_microtask != (microtask_t)0x0) {
    pkVar3 = (pkVar1->th).th_team;
    iVar2 = (pkVar3->t).t_level;
    iVar4 = (pkVar1->th).th_teams_level + 1;
    if (iVar4 < iVar2) {
      do {
        uVar6 = (pkVar3->t).t_serialized;
        uVar5 = uVar6;
        if ((int)uVar6 < 1) {
LAB_001186c3:
          pkVar3 = (pkVar3->t).t_parent;
          iVar2 = iVar2 + -1;
        }
        else {
          do {
            uVar6 = uVar5 - 1;
            iVar2 = iVar2 + -1;
            if (uVar5 < 2) break;
            uVar5 = uVar6;
          } while (iVar4 < iVar2);
          if (uVar6 == 0) {
            pkVar3 = (pkVar3->t).t_parent;
            uVar6 = 0;
          }
          else if (iVar4 < iVar2) goto LAB_001186c3;
        }
      } while (iVar4 < iVar2);
    }
    else {
      uVar6 = (pkVar3->t).t_serialized;
    }
    iVar2 = 0;
    if ((int)uVar6 < 2) {
      iVar2 = (pkVar3->t).t_master_tid;
    }
  }
  return iVar2;
}

Assistant:

int FTN_STDCALL
xexpand(FTN_GET_TEAM_NUM)( void )
{
    #ifdef KMP_STUB
        return 0;
    #else
        kmp_info_t *thr = __kmp_entry_thread();
        if ( thr->th.th_teams_microtask ) {
            kmp_team_t *team = thr->th.th_team;
            int tlevel = thr->th.th_teams_level; // the level of the teams construct
            int ii = team->t.t_level;
            int dd = team -> t.t_serialized;
            int level = tlevel + 1;
            KMP_DEBUG_ASSERT( ii >= tlevel );
            while( ii > level )
            {
                for( dd = team -> t.t_serialized; ( dd > 0 ) && ( ii > level ); dd--, ii-- )
                {
                }
                if( team -> t.t_serialized && ( !dd ) ) {
                    team = team->t.t_parent;
                    continue;
                }
                if( ii > level ) {
                    team = team->t.t_parent;
                    ii--;
                }
            }
            if ( dd > 1 ) {
                return 0;  // teams region is serialized ( 1 team of 1 thread ).
            } else {
                return team->t.t_master_tid;
            }
        } else {
            return 0;
        }
    #endif
}